

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int __thiscall CSnapIDPool::NewID(CSnapIDPool *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int64 iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar3 = time_get();
  lVar4 = (long)this->m_FirstTimed;
  if (lVar4 == -1) {
    iVar7 = this->m_FirstFree;
  }
  else {
    iVar7 = this->m_FirstFree;
    if (this->m_aIDs[lVar4].m_Timeout < iVar3) {
      iVar5 = this->m_Usage;
      iVar6 = iVar7;
      iVar8 = this->m_FirstTimed;
      do {
        iVar7 = iVar8;
        iVar5 = iVar5 + -1;
        iVar8 = (int)this->m_aIDs[lVar4].m_Next;
        this->m_aIDs[lVar4].m_Next = (short)iVar6;
        this->m_aIDs[lVar4].m_State = 0;
        if (iVar8 == -1) {
          this->m_FirstFree = iVar7;
          this->m_FirstTimed = -1;
          this->m_LastTimed = -1;
          this->m_Usage = iVar5;
          goto LAB_001102a9;
        }
        this->m_Usage = iVar5;
        lVar4 = (long)iVar8;
        iVar6 = iVar7;
      } while (this->m_aIDs[lVar4].m_Timeout < iVar3);
      this->m_FirstFree = iVar7;
      this->m_FirstTimed = iVar8;
    }
  }
LAB_001102a9:
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                 ,0x5a,(uint)(iVar7 != -1),"id error");
  if (iVar7 != -1) {
    this->m_FirstFree = (int)this->m_aIDs[this->m_FirstFree].m_Next;
    this->m_aIDs[iVar7].m_State = 1;
    uVar1 = this->m_Usage;
    uVar2 = this->m_InUsage;
    this->m_Usage = uVar1 + 1;
    this->m_InUsage = uVar2 + 1;
  }
  return iVar7;
}

Assistant:

int CSnapIDPool::NewID()
{
	int64 Now = time_get();

	// process timed ids
	while(m_FirstTimed != -1 && m_aIDs[m_FirstTimed].m_Timeout < Now)
		RemoveFirstTimeout();

	int ID = m_FirstFree;
	dbg_assert(ID != -1, "id error");
	if(ID == -1)
		return ID;
	m_FirstFree = m_aIDs[m_FirstFree].m_Next;
	m_aIDs[ID].m_State = 1;
	m_Usage++;
	m_InUsage++;
	return ID;
}